

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O2

void __thiscall libtorrent::lcrypto::hasher::~hasher(hasher *this)

{
  if (this->m_context != (EVP_MD_CTX *)0x0) {
    EVP_MD_CTX_free();
  }
  return;
}

Assistant:

hasher::~hasher()
	{
#if defined TORRENT_USE_LIBGCRYPT
		gcry_md_close(m_context);
#elif defined TORRENT_USE_LIBCRYPTO
#if OPENSSL_VERSION_NUMBER >= 0x10100000L
		if (m_context) EVP_MD_CTX_free(m_context);
#else
		if (m_context) EVP_MD_CTX_destroy(m_context);
#endif
#endif
	}